

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.cpp
# Opt level: O0

bool __thiscall
ObjectIdentifier::DecodeLong
          (ObjectIdentifier *this,uchar *in,size_t cbIn,unsigned_long *out,size_t *cbRead)

{
  uint local_44;
  ulong uStack_40;
  uint i;
  unsigned_long_long tmp;
  size_t *cbRead_local;
  unsigned_long *out_local;
  size_t cbIn_local;
  uchar *in_local;
  ObjectIdentifier *this_local;
  
  uStack_40 = 0;
  local_44 = 0;
  while ((local_44 < cbIn && local_44 < 6 &&
         (uStack_40 = (long)(int)(in[local_44] & 0x7f) + uStack_40, (in[local_44] & 0x80) != 0))) {
    uStack_40 = uStack_40 * 0x80;
    local_44 = local_44 + 1;
  }
  if ((uStack_40 >> 0x20 == 0) && (local_44 != 6)) {
    *out = uStack_40;
    *cbRead = (ulong)(local_44 + 1);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ObjectIdentifier::DecodeLong(const unsigned char * in, size_t cbIn, unsigned long & out, size_t & cbRead) const
{
	unsigned long long tmp = 0;

	unsigned int i;
	for (i = 0; i < cbIn && i < 6; ++i)
	{
		// we can't possibly overflow a 64-bit value with only 42 bits of input
		tmp += 0x7f & in[i];

		if ((in[i] & 0x80) == 0)
			break;

		tmp <<= 7;
	}

	if (tmp >> 32 != 0 || i == 6)
	{
		// malformed input
		return false;
	}

	out = static_cast<unsigned long>(tmp);
	cbRead = i + 1;
	return true;
}